

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O1

type __thiscall
jsoncons::jsonpointer::
remove<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,char[6]>
          (jsonpointer *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
          char (*location_str) [6],error_code *ec)

{
  basic_json_pointer<char> jsonptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  string_view_type local_28;
  
  local_28._M_len = strlen((char *)root);
  local_28._M_str = (char *)root;
  basic_json_pointer<char>::parse
            ((basic_json_pointer<char> *)&local_40,&local_28,(error_code *)location_str);
  if (*(int *)*location_str == 0) {
    remove<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
              (this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                    &local_40,(basic_json_pointer<char> *)location_str,ec);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

typename std::enable_if<std::is_convertible<StringSource,jsoncons::basic_string_view<typename Json::char_type>>::value,void>::type
    remove(Json& root, const StringSource& location_str, std::error_code& ec)
    {
        auto jsonptr = basic_json_pointer<typename Json::char_type>::parse(location_str, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        remove(root, jsonptr, ec);
    }